

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall
kratos::GeneratorGraphVisitor::visit(GeneratorGraphVisitor *this,Generator *generator)

{
  Generator *pGVar1;
  GeneratorNode *pGVar2;
  GeneratorNode *pGVar3;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer psVar4;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  string local_80;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_60;
  pointer local_48;
  size_type sStack_40;
  GeneratorGraphVisitor *local_38;
  
  local_38 = this;
  pGVar2 = GeneratorGraph::get_node(this->g_,generator);
  Generator::get_child_generators(&local_60,generator);
  psVar4 = local_60.
           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar4 == local_60.
                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector(&local_60);
      return;
    }
    pGVar3 = GeneratorGraph::get_node
                       (local_38->g_,
                        (psVar4->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    if (pGVar3->parent != (GeneratorNode *)0x0) break;
    pGVar3->parent = pGVar2;
    std::
    _Rb_tree<kratos::Generator*,kratos::Generator*,std::_Identity<kratos::Generator*>,std::less<kratos::Generator*>,std::allocator<kratos::Generator*>>
    ::_M_emplace_unique<kratos::Generator*&>
              ((_Rb_tree<kratos::Generator*,kratos::Generator*,std::_Identity<kratos::Generator*>,std::less<kratos::Generator*>,std::allocator<kratos::Generator*>>
                *)&pGVar2->children,&pGVar3->generator);
    psVar4 = psVar4 + 1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  pGVar1 = pGVar3->parent->generator;
  local_48 = (pGVar1->instance_name)._M_dataplus._M_p;
  sStack_40 = (pGVar1->instance_name)._M_string_length;
  bVar5 = fmt::v7::to_string_view<char,_0>("{0} already has a parent");
  format_str.data_ = (char *)bVar5.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_80,(detail *)bVar5.data_,format_str,args);
  InternalException::InternalException(this_00,&local_80);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit(Generator *generator) override {
        auto *parent_node = g_->get_node(generator);
        for (auto const &child : generator->get_child_generators()) {
            auto *child_node = g_->get_node(child.get());
            if (child_node->parent != nullptr)
                throw InternalException(::format("{0} already has a parent",
                                                 child_node->parent->generator->instance_name));
            child_node->parent = parent_node;
            parent_node->children.emplace(child_node->generator);
        }
    }